

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_signature_algorithms(ptls_verify_certificate_t *vc,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  size_t sVar6;
  uint16_t *puVar7;
  bool bVar8;
  
  iVar2 = ptls_buffer_reserve(sendbuf,2);
  if (iVar2 == 0) {
    puVar1 = sendbuf->base;
    sVar6 = sendbuf->off;
    (puVar1 + sVar6)[0] = '\0';
    (puVar1 + sVar6)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    if (vc == (ptls_verify_certificate_t *)0x0) {
      puVar7 = push_signature_algorithms::default_algos;
    }
    else {
      puVar7 = vc->algos;
    }
    sVar6 = sendbuf->off;
    uVar5 = *puVar7;
    if (uVar5 == 0xffff) {
      iVar2 = 0;
      bVar8 = true;
    }
    else {
      do {
        puVar7 = puVar7 + 1;
        iVar2 = ptls_buffer_reserve(sendbuf,2);
        if (iVar2 == 0) {
          *(ushort *)(sendbuf->base + sendbuf->off) = uVar5 << 8 | uVar5 >> 8;
          sendbuf->off = sendbuf->off + 2;
          iVar2 = 0;
        }
        bVar8 = iVar2 == 0;
      } while ((bVar8) && (uVar5 = *puVar7, uVar5 != 0xffff));
    }
    if (bVar8) {
      uVar3 = sendbuf->off - sVar6;
      lVar4 = 8;
      do {
        sendbuf->base[sVar6 - 2] = (uint8_t)(uVar3 >> ((byte)lVar4 & 0x3f));
        lVar4 = lVar4 + -8;
        sVar6 = sVar6 + 1;
      } while (lVar4 != -8);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int push_signature_algorithms(ptls_verify_certificate_t *vc, ptls_buffer_t *sendbuf)
{
    /* The list sent when verify callback is not registered */
    static const uint16_t default_algos[] = {PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256,
                                             PTLS_SIGNATURE_RSA_PKCS1_SHA256, PTLS_SIGNATURE_RSA_PKCS1_SHA1, UINT16_MAX};
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        for (const uint16_t *p = vc != NULL ? vc->algos : default_algos; *p != UINT16_MAX; ++p)
            ptls_buffer_push16(sendbuf, *p);
    });

    ret = 0;
Exit:
    return ret;
}